

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O0

void __thiscall BingoGenerator::init_lifestock_goals(BingoGenerator *this)

{
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88;
  int i_1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  BingoGenerator *pBStack_10;
  int i;
  BingoGenerator *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0x1e; local_14 < 0x47; local_14 = local_14 + 10) {
    std::__cxx11::to_string(&local_78,local_14);
    std::operator+(&local_58,"Reach ",&local_78);
    std::operator+(&local_38,&local_58," total life");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_lifestock_goals,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  for (local_88 = 2; local_88 < 7; local_88 = local_88 + 1) {
    std::__cxx11::to_string(&local_e8,local_88);
    std::operator+(&local_c8,"Buy ",&local_e8);
    std::operator+(&local_a8,&local_c8," Life Stock in shops");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->_lifestock_goals,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  vectools::shuffle<std::__cxx11::string>(&this->_lifestock_goals,&this->_rng);
  return;
}

Assistant:

void init_lifestock_goals()
    {
        for(int i = 30 ; i <= 70 ; i += 10)
            _lifestock_goals.emplace_back("Reach " + std::to_string(i) + " total life");
        for(int i = 2 ; i <= 6 ; ++i)
            _lifestock_goals.emplace_back("Buy " + std::to_string(i) + " Life Stock in shops");
        vectools::shuffle(_lifestock_goals, _rng);
    }